

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

int __thiscall xmrig::CudaBackendPrivate::init(CudaBackendPrivate *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  int iVar4;
  uint32_t uVar5;
  int extraout_EAX;
  uint32_t uVar6;
  uint32_t uVar7;
  char *pcVar8;
  pointer extraout_RAX;
  ulong uVar9;
  undefined4 extraout_var;
  size_t sVar10;
  size_t sVar11;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  pointer pCVar12;
  uint32_t version;
  uint32_t version_00;
  pointer this_00;
  undefined1 local_98 [32];
  pointer local_78;
  undefined8 local_70;
  char *local_68;
  pointer local_60;
  string local_58;
  
  if (*ctx == (EVP_PKEY_CTX)0x0) {
    pcVar8 = "";
LAB_0016a0d5:
    Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;31mdisabled\x1b[0m%s","CUDA",pcVar8
              );
    return extraout_EAX;
  }
  iVar4 = CudaLib::init(*(EVP_PKEY_CTX **)(ctx + 0x20));
  if ((char)iVar4 == '\0') {
    pcVar8 = "\x1b[0;31m (failed to load CUDA plugin)";
    goto LAB_0016a0d5;
  }
  uVar5 = CudaLib::runtimeVersion();
  this->runtimeVersion = uVar5;
  uVar5 = CudaLib::driverVersion();
  this->driverVersion = uVar5;
  if (((uVar5 == 0) || (this->runtimeVersion == 0)) || (uVar5 = CudaLib::deviceCount(), uVar5 == 0))
  {
    pcVar8 = "\x1b[0;31m (no devices)";
    goto LAB_0016a0d5;
  }
  pCVar12 = (this->devices).
            super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pCVar12 !=
      (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
      _M_impl.super__Vector_impl_data._M_finish) goto LAB_0016a083;
  CudaLib::devices((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)&local_58,
                   *(int32_t *)(ctx + 0x60),*(int32_t *)(ctx + 100),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ctx + 8));
  local_98._16_8_ =
       (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_58.field_2._M_allocated_capacity;
  local_98._0_8_ =
       (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_98._8_8_ =
       (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58._M_dataplus._M_p;
  (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_58._M_string_length;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector
            ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)local_98);
  std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::~vector
            ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)&local_58);
  if ((this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;31mdisabled\x1b[0m%s","CUDA",
               "\x1b[0;31m (no devices)");
    pCVar12 = extraout_RAX;
    goto LAB_0016a083;
  }
  CudaLib::version_abi_cxx11_((string *)local_98,(CudaLib *)(ulong)this->runtimeVersion,version);
  uVar2 = local_98._0_8_;
  CudaLib::version_abi_cxx11_(&local_58,(CudaLib *)(ulong)this->driverVersion,version_00);
  _Var3._M_p = local_58._M_dataplus._M_p;
  pcVar8 = CudaLib::pluginVersion();
  Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;37m%s\x1b[0m\x1b[1;30m/%s\x1b[0m"
             ,"CUDA",uVar2,_Var3._M_p,pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_);
  }
  if (ctx[0x68] == (EVP_PKEY_CTX)0x1) {
    iVar4 = NvmlLib::init(*(EVP_PKEY_CTX **)(ctx + 0x70));
    if ((char)iVar4 == '\0') {
      pcVar8 = "\x1b[0;31m (failed to load NVML)";
      goto LAB_0016a24e;
    }
    NvmlLib::assign(&this->devices);
    Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;32m%s\x1b[0m press \x1b[45m\x1b[1;37me\x1b[0m for health report"
               ,"NVML",NvmlLib::m_nvmlVersion,NvmlLib::m_driverVersion);
  }
  else {
    pcVar8 = "";
LAB_0016a24e:
    Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;31mdisabled\x1b[0m%s","NVML",pcVar8
              );
  }
  this_00 = (this->devices).
            super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar12 = (this->devices).
            super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_78 = pCVar12;
  if (this_00 != pCVar12) {
    do {
      uVar1 = this_00->m_index;
      PciTopology::toString((PciTopology *)local_98);
      local_60 = (pointer)local_98._0_8_;
      local_68 = (this_00->m_name).m_data;
      uVar9 = CudaDevice::clock(this_00);
      uVar5 = CudaDevice::memoryClock(this_00);
      local_70 = CONCAT44(extraout_var,uVar5);
      uVar5 = CudaDevice::smx(this_00);
      uVar6 = CudaDevice::computeCapability(this_00,true);
      uVar7 = CudaDevice::computeCapability(this_00,false);
      sVar10 = CudaDevice::freeMemSize(this_00);
      sVar11 = CudaDevice::globalMemSize(this_00);
      Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu\x1b[0m\x1b[0;33m %s\x1b[0m\x1b[1;32m %s \x1b[0m\x1b[1;37m%u/%u MHz\x1b[0m smx:\x1b[1;37m%u\x1b[0m arch:\x1b[1;37m%u%u\x1b[0m mem:\x1b[0;36m%zu/%zu\x1b[0m MB"
                 ,"CUDA GPU",(ulong)uVar1,local_60,local_68,uVar9 & 0xffffffff,local_70,(ulong)uVar5
                 ,(ulong)uVar6,(ulong)uVar7,sVar10 >> 0x14,sVar11 >> 0x14);
      pCVar12 = extraout_RAX_00;
      if ((pointer)local_98._0_8_ != (pointer)0x0) {
        operator_delete__((void *)local_98._0_8_);
        pCVar12 = extraout_RAX_01;
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_78);
  }
LAB_0016a083:
  return (int)pCVar12;
}

Assistant:

void init(const CudaConfig &cuda)
    {
        if (!cuda.isEnabled()) {
            return printDisabled(kLabel, "");
        }

        if (!CudaLib::init(cuda.loader())) {
            return printDisabled(kLabel, RED_S " (failed to load CUDA plugin)");
        }

        runtimeVersion = CudaLib::runtimeVersion();
        driverVersion  = CudaLib::driverVersion();

        if (!runtimeVersion || !driverVersion || !CudaLib::deviceCount()) {
            return printDisabled(kLabel, RED_S " (no devices)");
        }

        if (!devices.empty()) {
            return;
        }

        devices = CudaLib::devices(cuda.bfactor(), cuda.bsleep(), cuda.devicesHint());
        if (devices.empty()) {
            return printDisabled(kLabel, RED_S " (no devices)");
        }

        Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") WHITE_BOLD("%s") "/" WHITE_BOLD("%s") BLACK_BOLD("/%s"), kLabel,
                   CudaLib::version(runtimeVersion).c_str(), CudaLib::version(driverVersion).c_str(), CudaLib::pluginVersion());

#       ifdef XMRIG_FEATURE_NVML
        if (cuda.isNvmlEnabled()) {
            if (NvmlLib::init(cuda.nvmlLoader())) {
                NvmlLib::assign(devices);

                Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") WHITE_BOLD("%s") "/" GREEN_BOLD("%s") " press " MAGENTA_BG(WHITE_BOLD_S "e") " for health report",
                           kNvmlLabel,
                           NvmlLib::version(),
                           NvmlLib::driverVersion()
                           );
            }
            else {
                printDisabled(kNvmlLabel, RED_S " (failed to load NVML)");
            }
        }
        else {
            printDisabled(kNvmlLabel, "");
        }
#       endif

        for (const CudaDevice &device : devices) {
            Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu") YELLOW(" %s") GREEN_BOLD(" %s ") WHITE_BOLD("%u/%u MHz") " smx:" WHITE_BOLD("%u") " arch:" WHITE_BOLD("%u%u") " mem:" CYAN("%zu/%zu") " MB",
                       "CUDA GPU",
                       device.index(),
                       device.topology().toString().data(),
                       device.name().data(),
                       device.clock(),
                       device.memoryClock(),
                       device.smx(),
                       device.computeCapability(true),
                       device.computeCapability(false),
                       device.freeMemSize() / oneMiB,
                       device.globalMemSize() / oneMiB);
        }
    }